

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_file_tests.cpp
# Opt level: O1

void __thiscall
iu_StdFileUnitTest_x_iutest_x_FileSizeFromPath_Test::Body
          (iu_StdFileUnitTest_x_iutest_x_FileSizeFromPath_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  char *pcVar3;
  _Alloc_hider _Var4;
  unsigned_long *in_R9;
  AssertionResult iutest_ar;
  iu_uint_max_t expectedSize;
  FilePath file_path;
  StatStruct file_stat;
  allocator<char> local_239;
  AssertionResult local_238;
  AssertionHelper local_210;
  string local_1e0;
  char local_1c0 [8];
  iuFilePath local_1b8;
  undefined1 local_198 [392];
  
  local_1c0[0] = '\0';
  local_1c0[1] = '\0';
  local_1c0[2] = '\0';
  local_1c0[3] = '\0';
  local_1c0[4] = '\x01';
  local_1c0[5] = '\0';
  local_1c0[6] = '\0';
  local_1c0[7] = '\0';
  iutest::detail::iuFilePath::iuFilePath(&local_1b8,"./testdata/4gb.bin");
  iVar2 = stat64(local_1b8.m_path._M_dataplus._M_p,(stat64 *)local_198);
  paVar1 = &local_238.m_message.field_2;
  local_238.m_message._M_string_length = 0;
  local_238.m_message.field_2._M_local_buf[0] = '\0';
  local_238.m_result = iVar2 == 0;
  local_238.m_message._M_dataplus._M_p = (pointer)paVar1;
  if (local_238.m_result) {
    local_210.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = "./testdata/4gb.bin";
    std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
              ((path *)local_198,(char **)&local_210,auto_format);
    pcVar3 = (char *)std::filesystem::file_size((path *)local_198);
    std::filesystem::__cxx11::path::~path((path *)local_198);
    local_1e0._M_dataplus._M_p = pcVar3;
    iutest::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              (&local_238,(internal *)"expectedSize",
               "::iutest::internal::posix::FileSizeFromPath(path)",local_1c0,
               (unsigned_long *)&local_1e0,in_R9);
    if (local_238.m_result != false) goto LAB_00149733;
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,local_238.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_1e0);
    local_210.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_file_tests.cpp"
    ;
    local_210.m_part_result.super_iuCodeMessage.m_line = 0x80;
    local_210.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_210,(Fixed *)local_198,false);
    _Var4._M_p = local_210.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_210.m_part_result.super_iuCodeMessage.m_message.field_2) goto LAB_0014970a;
  }
  else {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_1e0,(internal *)&local_238,
               (AssertionResult *)"file_path.FileOrDirectoryExists()","false","true",(char *)in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,local_1e0._M_dataplus._M_p,&local_239);
    local_210.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_file_tests.cpp"
    ;
    local_210.m_part_result.super_iuCodeMessage.m_line = 0x7f;
    local_210.m_part_result.super_iuCodeMessage._44_4_ = 0xfffffffd;
    iutest::AssertionHelper::OnFixed(&local_210,(Fixed *)local_198,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_210.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_210.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_210.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    local_210.m_part_result.super_iuCodeMessage.m_message.field_2._M_allocated_capacity =
         local_1e0.field_2._M_allocated_capacity;
    _Var4._M_p = local_1e0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
LAB_0014970a:
      operator_delete(_Var4._M_p,
                      local_210.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
  std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
LAB_00149733:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_238.m_message._M_dataplus._M_p,
                    CONCAT71(local_238.m_message.field_2._M_allocated_capacity._1_7_,
                             local_238.m_message.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8.m_path._M_dataplus._M_p != &local_1b8.m_path.field_2) {
    operator_delete(local_1b8.m_path._M_dataplus._M_p,
                    local_1b8.m_path.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST(StdFileUnitTest, FileSizeFromPath)
{
    const ::iutest::iu_uint_max_t expectedSize = 0x100000000ull;
    const char* path = "./testdata/4gb.bin";
    ::iutest::internal::FilePath file_path = ::iutest::internal::FilePath(path);
    IUTEST_ASSUME_TRUE (file_path.FileOrDirectoryExists());
    IUTEST_ASSERT_EQ(expectedSize, ::iutest::internal::posix::FileSizeFromPath(path));
}